

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::Draw::
InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
::createInstance(InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
                 *this,Context *context)

{
  IndirectDraw *this_00;
  VkPhysicalDeviceFeatures *pVVar1;
  NotSupportedError *this_01;
  string local_b8;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_98;
  VkPrimitiveTopology local_68;
  undefined4 uStack_64;
  TestSpec local_60;
  
  this_00 = (IndirectDraw *)operator_new(0x218);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_98,
             (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)&this->m_testSpec);
  local_68 = (this->m_testSpec).super_TestSpecBase.topology;
  uStack_64 = *(undefined4 *)&(this->m_testSpec).super_TestSpecBase.field_0x34;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)&local_60,&local_98);
  local_60.super_TestSpecBase._52_4_ = uStack_64;
  local_60.super_TestSpecBase.topology = local_68;
  Draw::anon_unknown_0::IndirectDraw::IndirectDraw(this_00,context,&local_60);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_60);
  (this_00->super_DrawTestsBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__IndirectDraw_00d609b0;
  pVVar1 = Context::getDeviceFeatures
                     ((this_00->super_DrawTestsBaseClass).super_TestInstance.m_context);
  if (pVVar1->drawIndirectFirstInstance == 1) {
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_98);
    return (TestInstance *)this_00;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"Required \'drawIndirectFirstInstance\' feature is not supported",
             "");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_b8);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_testSpec);
	}